

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O0

err_t cmdFileBehead(char *name,size_t count)

{
  bool_t bVar1;
  file_t pFVar2;
  size_t sVar3;
  blob_t buf_00;
  file_t pFVar4;
  ulong in_RSI;
  bool bVar5;
  size_t c;
  void *buf;
  size_t pos;
  size_t size;
  file_t file;
  err_t code;
  size_t buf_size;
  char *in_stack_ffffffffffffff98;
  file_t in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar6;
  ulong local_40;
  err_t local_24;
  err_t local_4;
  
  pFVar2 = fileOpen((char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_24 = 0xcb;
  if (pFVar2 != (file_t)0x0) {
    local_24 = 0;
  }
  local_4 = local_24;
  if (local_24 == 0) {
    sVar3 = fileSize((file_t)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if (sVar3 == 0xffffffffffffffff) {
      local_24 = 0xcf;
    }
    else if (sVar3 < in_RSI) {
      local_24 = 0xd1;
    }
    if (local_24 == 0) {
      buf_00 = blobCreate((size_t)in_stack_ffffffffffffff98);
      local_24 = 0x6e;
      if (buf_00 != (blob_t)0x0) {
        local_24 = 0;
      }
      if (local_24 == 0) {
        for (local_40 = 0; bVar5 = local_40 < sVar3 - in_RSI, uVar6 = local_24 == 0 && bVar5,
            local_24 == 0 && bVar5; local_40 = (long)&pFVar2->_flags + local_40) {
          if ((sVar3 - in_RSI) - local_40 < 0x1001) {
            in_stack_ffffffffffffffa0 = (file_t)((sVar3 - in_RSI) - local_40);
          }
          else {
            in_stack_ffffffffffffffa0 = (file_t)&DAT_00001000;
          }
          pFVar2 = in_stack_ffffffffffffffa0;
          bVar1 = fileSeek(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,0);
          if (((bVar1 == 0) ||
              (pFVar4 = (file_t)fileRead2(buf_00,(size_t)pFVar2,
                                          (file_t)CONCAT17(uVar6,in_stack_ffffffffffffffa8)),
              pFVar4 != pFVar2)) ||
             (bVar1 = fileSeek(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,0),
             bVar1 == 0)) {
            local_24 = 0xcf;
          }
          else {
            local_24 = fileWrite((size_t *)CONCAT17(uVar6,in_stack_ffffffffffffffa8),
                                 in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                                 (file_t)0x1056e9);
          }
        }
        blobClose((blob_t)0x10570b);
        if (local_24 == 0) {
          bVar1 = fileTrunc(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
          if (bVar1 == 0) {
            local_24 = 0xce;
          }
          if (local_24 == 0) {
            bVar1 = fileClose((file_t)0x10576c);
            local_4 = 0x67;
            if (bVar1 != 0) {
              local_4 = 0;
            }
          }
          else {
            fileClose((file_t)0x105758);
            local_4 = local_24;
          }
        }
        else {
          fileClose((file_t)0x10571c);
          local_4 = local_24;
        }
      }
      else {
        fileClose((file_t)0x1055ee);
        local_4 = local_24;
      }
    }
    else {
      fileClose((file_t)0x1055ac);
      local_4 = local_24;
    }
  }
  return local_4;
}

Assistant:

err_t cmdFileBehead(const char* name, size_t count)
{
	const size_t buf_size = 4096;
	err_t code;
	file_t file;
	size_t size;
	size_t pos;
	void* buf;
	// pre
	ASSERT(strIsValid(name));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < count)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// сдвинуть содержимое файла влево
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	for (pos = 0; code == ERR_OK && pos < size - count;)
	{
		size_t c = MIN2(buf_size, size - count - pos);
		if (!fileSeek(file, pos + count, SEEK_SET) ||
			fileRead2(buf, c, file) != c ||
			!fileSeek(file, pos, SEEK_SET))
			code = ERR_FILE_READ;
		else
			code = fileWrite(&c, buf, c, file);
		pos += c;
	}
	cmdBlobClose(buf);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// обрезать файл
	if (!fileTrunc(file, size - count))
		code = ERR_FILE_WRITE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}